

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

QString * QSettingsPrivate::normalizedKey(QString *__return_storage_ptr__,QAnyStringView key)

{
  char cVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  char16_t *pcVar3;
  QLatin1 *pQVar4;
  char *in_RCX;
  char16_t *pcVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  char16_t *this;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar10;
  QLatin1StringView in;
  QByteArrayView in_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  
  aVar2 = key.field_0;
  uVar8 = key.m_size & 0x3fffffffffffffff;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,uVar8,Uninitialized);
  this = (__return_storage_ptr__->d).ptr;
  if ((QLatin1 *)this == (QLatin1 *)0x0) {
    this = L"";
  }
  if ((key.m_size & 0xc000000000000000) == 0x4000000000000000) {
    pcVar9 = uVar8 + aVar2.m_data_utf8;
    while (aVar10 = aVar2, aVar6 = aVar2, (char *)aVar2.m_data != pcVar9) {
      while( true ) {
        aVar6.m_data = aVar6.m_data + 1;
        in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),*aVar10.m_data_utf8);
        if (*aVar10.m_data_utf8 != '/') break;
        aVar10.m_data = aVar10.m_data + 1;
        aVar2.m_data = aVar2.m_data + 1;
        if ((char *)aVar10.m_data == pcVar9) goto LAB_003d5847;
      }
      for (; (char)in_RCX != '/'; in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),cVar1)) {
        pcVar7 = pcVar9;
        if ((char *)aVar6.m_data == pcVar9) goto LAB_003d57ad;
        cVar1 = *aVar6.m_data_utf8;
        aVar6.m_data = aVar6.m_data + 1;
      }
      pcVar7 = aVar6.m_data_utf8 + -1;
LAB_003d57ad:
      in.m_data = in_RCX;
      in.m_size = (qsizetype)aVar10.m_data;
      pQVar4 = (QLatin1 *)
               QLatin1::convertToUnicode
                         ((QLatin1 *)this,(char16_t *)(pcVar7 + -(long)aVar2.m_data),in);
      uVar8 = extraout_RDX;
      if (pcVar7 == pcVar9) goto LAB_003d58a3;
      this = (char16_t *)(pQVar4 + 2);
      *(char16_t *)pQVar4 = L'/';
      aVar2.m_data = pcVar7 + 1;
    }
  }
  else {
    pcVar9 = uVar8 + aVar2.m_data_utf8;
    while (aVar10 = aVar2, aVar6 = aVar2, (char *)aVar2.m_data != pcVar9) {
      while( true ) {
        aVar6.m_data = aVar6.m_data + 1;
        in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),*aVar10.m_data_utf8);
        if (*aVar10.m_data_utf8 != '/') break;
        aVar10.m_data = aVar10.m_data + 1;
        aVar2.m_data = aVar2.m_data + 1;
        if ((char *)aVar10.m_data == pcVar9) goto LAB_003d5847;
      }
      for (; (char)in_RCX != '/'; in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),cVar1)) {
        pcVar7 = pcVar9;
        if ((char *)aVar6.m_data == pcVar9) goto LAB_003d5819;
        cVar1 = *aVar6.m_data_utf8;
        aVar6.m_data = aVar6.m_data + 1;
      }
      pcVar7 = aVar6.m_data_utf8 + -1;
LAB_003d5819:
      in_00.m_data = in_RCX;
      in_00.m_size = (qsizetype)aVar10.m_data;
      pQVar4 = (QLatin1 *)
               QUtf8::convertToUnicode
                         ((QUtf8 *)this,(char16_t *)(pcVar7 + -(long)aVar2.m_data),in_00);
      uVar8 = extraout_RDX_00;
      if (pcVar7 == pcVar9) goto LAB_003d58a3;
      this = (char16_t *)(pQVar4 + 2);
      *(char16_t *)pQVar4 = L'/';
      aVar2.m_data = pcVar7 + 1;
    }
  }
LAB_003d5847:
  pcVar5 = (__return_storage_ptr__->d).ptr;
  pcVar3 = pcVar5;
  if ((QLatin1 *)pcVar5 == (QLatin1 *)0x0) {
    pcVar3 = L"";
  }
  uVar8 = (ulong)(this == pcVar3);
  pQVar4 = (QLatin1 *)((long)this + uVar8 * 2 + -2);
LAB_003d586a:
  if ((QLatin1 *)pcVar5 == (QLatin1 *)0x0) {
    pcVar5 = L"";
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)pQVar4 - (long)pcVar5 >> 1),uVar8);
  return __return_storage_ptr__;
LAB_003d58a3:
  pcVar5 = (__return_storage_ptr__->d).ptr;
  goto LAB_003d586a;
}

Assistant:

QString QSettingsPrivate::normalizedKey(QAnyStringView key)
{
    QString result(key.size(), Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData()); // don't detach

    const bool maybeEndsInSlash = key.visit([&out](auto key) {
        using View = decltype(key);

        auto it = key.begin();
        const auto end = key.end();

        while (it != end) {
            while (*it == u'/') {
                ++it;
                if (it == end)
                    return true;
            }
            auto mark = it;
            while (*it != u'/') {
                ++it;
                if (it == end)
                    break;
            }
            out = write(out, View{mark, it});
            if (it == end)
                return false;
            Q_ASSERT(*it == u'/');
            *out++ = u'/';
            ++it;
        }
        return true;
    });

    if (maybeEndsInSlash && out != result.constData())
        --out; // remove the trailing slash
    result.truncate(out - result.constData());
    return result;
}